

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

int __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector::select
          (Selector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer pvVar4;
  uint *puVar5;
  Index IVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  TopologicalOrdersImpl<std::less<unsigned_int>_> *this_00;
  uint *puVar8;
  
  this_00 = (TopologicalOrdersImpl<std::less<unsigned_int>_> *)CONCAT44(in_register_00000034,__nfds)
  ;
  if (this->count == 0) {
    __assert_fail("count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xde,
                  "Selector wasm::TopologicalOrdersImpl<std::less<unsigned int>>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = std::less<unsigned int>]"
                 );
  }
  if ((ulong)(this->count + this->start) <=
      (ulong)((long)(this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
    IVar6 = popChoice(this_00);
    puVar3 = (this_00->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3[this->start] = IVar6;
    uVar1 = this->start;
    uVar2 = puVar3[uVar1];
    pvVar4 = (this_00->graph->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar8 = *(uint **)&pvVar4[uVar2].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    puVar5 = *(pointer *)
              ((long)&pvVar4[uVar2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl + 8);
    while( true ) {
      if (puVar8 == puVar5) {
        return uVar1 + 1;
      }
      uVar2 = *puVar8;
      puVar3 = (this_00->indegrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = puVar3[uVar2];
      if (uVar7 == 0) break;
      uVar7 = uVar7 - 1;
      puVar3[uVar2] = uVar7;
      if (uVar7 == 0) {
        pushChoice(this_00,uVar2);
      }
      puVar8 = puVar8 + 1;
    }
    __assert_fail("ctx.indegrees[child] > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xea,
                  "Selector wasm::TopologicalOrdersImpl<std::less<unsigned int>>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = std::less<unsigned int>]"
                 );
  }
  __assert_fail("start + count <= ctx.buf.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xdf,
                "Selector wasm::TopologicalOrdersImpl<std::less<unsigned int>>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = std::less<unsigned int>]"
               );
}

Assistant:

Selector select(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      assert(start + count <= ctx.buf.size());
      if constexpr (TopologicalOrdersImpl::useMinHeap) {
        ctx.buf[start] = ctx.popChoice();
      }
      auto selection = ctx.buf[start];
      // The next selector will select the next index and will not be able to
      // choose the vertex we just selected.
      Selector next = {start + 1, count - 1, 0};
      // Append any child that this selection makes available to the choices for
      // the next selector.
      for (auto child : ctx.graph[selection]) {
        assert(ctx.indegrees[child] > 0);
        if (--ctx.indegrees[child] == 0) {
          if constexpr (TopologicalOrdersImpl::useMinHeap) {
            ctx.pushChoice(child);
          } else {
            ctx.buf[next.start + next.count] = child;
          }
          ++next.count;
        }
      }
      return next;
    }